

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::StmtScopeVisitor::handle_stmt(StmtScopeVisitor *this,Stmt *stmt)

{
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar1;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *this_00;
  _Hash_node_base *p_Var2;
  _Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  long *plVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pmVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  undefined4 extraout_var;
  mapped_type *ppSVar8;
  VarStmt *pVVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  InternalException *this_02;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar12;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar13;
  ulong uVar14;
  ulong uVar15;
  __node_base_ptr p_Var16;
  __node_base_ptr p_Var17;
  long *plVar18;
  uint ln;
  undefined8 scope;
  undefined1 local_e0 [8];
  Scope<std::nullptr_t> *stmt_scope;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  __node_base local_c0;
  size_type sStack_b8;
  float local_b0;
  size_t local_a8;
  _Alloc_hider _Stack_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  uint local_78;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *local_70;
  undefined1 local_68 [8];
  string filename;
  Stmt *parent_stmt;
  Stmt *local_38;
  Stmt *stmt_local;
  
  local_68 = (undefined1  [8])&filename._M_string_length;
  filename._M_dataplus._M_p = (pointer)0x0;
  filename._M_string_length._0_1_ = 0;
  local_e0 = (undefined1  [8])&local_d0;
  local_38 = stmt;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"debug-ignore","");
  bVar5 = IRNode::has_attribute(&stmt->super_IRNode,(string *)local_e0);
  if (local_e0 != (undefined1  [8])&local_d0) {
    operator_delete((void *)local_e0,(ulong)(local_d0._M_allocated_capacity + 1));
  }
  if (!bVar5) {
    this_00 = this->stmt_fn_ln_;
    pmVar1 = this_00 + 8;
    pmVar12 = pmVar1;
    for (pmVar13 = *(map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                     **)(this_00 + 0x10);
        pmVar13 !=
        (map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
         *)0x0; pmVar13 = *(map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                            **)(pmVar13 + (ulong)(*(Stmt **)(pmVar13 + 0x20) < local_38) * 8 + 0x10)
        ) {
      if (*(Stmt **)(pmVar13 + 0x20) >= local_38) {
        pmVar12 = pmVar13;
      }
    }
    pmVar13 = pmVar1;
    if ((pmVar12 != pmVar1) && (pmVar13 = pmVar12, local_38 < *(Stmt **)(pmVar12 + 0x20))) {
      pmVar13 = pmVar1;
    }
    if (pmVar13 == pmVar1) {
      ln = 0;
    }
    else {
      pmVar7 = std::
               map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
               ::at(this_00,&local_38);
      std::__cxx11::string::_M_assign((string *)local_68);
      ln = pmVar7->second;
    }
    iVar6 = (*(local_38->super_IRNode)._vptr_IRNode[4])();
    filename.field_2._8_8_ = CONCAT44(extraout_var,iVar6);
    if (*(int *)&((_Hash_node_base *)(filename.field_2._8_8_ + 0x48))->_M_nxt == 0) {
      filename.field_2._8_8_ =
           hgdb::json::Scope<hgdb::json::Module>::create_scope<hgdb::json::Scope<decltype(nullptr)>>
                     (&this->module_->super_Scope<hgdb::json::Module>);
      if (filename._M_dataplus._M_p == (pointer)0x0) {
        local_70 = this->stmt_fn_ln_;
        local_d0._M_allocated_capacity = (size_type)&_Stack_a0;
        stmt_scope._0_4_ = 0;
        local_d0._8_8_ = 1;
        local_c0._M_nxt = (_Hash_node_base *)0x0;
        sStack_b8 = 0;
        local_b0 = 1.0;
        local_a8 = 0;
        _Stack_a0._M_p = (pointer)0x0;
        local_e0 = (undefined1  [8])&PTR_visit_root_002c0630;
        local_90 = 0;
        local_88 = 0;
        local_78 = 0;
        local_98 = &local_88;
        IRVisitor::visit_root((IRVisitor *)local_e0,&local_38->super_IRNode);
        std::__cxx11::string::_M_assign((string *)local_68);
        ln = local_78;
        local_e0 = (undefined1  [8])&PTR_visit_root_002c0630;
        if (local_98 != &local_88) {
          operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
        }
        local_e0 = (undefined1  [8])&PTR_visit_root_002be390;
        std::
        _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&local_d0);
      }
      std::__cxx11::string::_M_assign((string *)(filename.field_2._8_8_ + 0x30));
      scope = filename.field_2._8_8_;
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->stmt_scope_mapping_,&local_38);
      if (local_38->type_ != Assign) goto LAB_001fc406;
    }
    else {
      uVar15 = (this->stmt_scope_mapping_)._M_h._M_bucket_count;
      uVar14 = (ulong)filename.field_2._8_8_ % uVar15;
      p_Var16 = (this->stmt_scope_mapping_)._M_h._M_buckets[uVar14];
      p_Var17 = (__node_base_ptr)0x0;
      if ((p_Var16 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var16->_M_nxt, p_Var17 = p_Var16,
         (_Hash_node_base *)filename.field_2._8_8_ != p_Var16->_M_nxt[1]._M_nxt)) {
        while (p_Var16 = p_Var2, p_Var2 = p_Var16->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var17 = (__node_base_ptr)0x0;
          if (((ulong)p_Var2[1]._M_nxt % uVar15 != uVar14) ||
             (p_Var17 = p_Var16, (_Hash_node_base *)filename.field_2._8_8_ == p_Var2[1]._M_nxt))
          goto LAB_001fc2c4;
        }
        p_Var17 = (__node_base_ptr)0x0;
      }
LAB_001fc2c4:
      if ((p_Var17 == (__node_base_ptr)0x0) || (p_Var17->_M_nxt == (_Hash_node_base *)0x0)) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_e0 = (undefined1  [8])&local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e0,"Scope not properly created","");
        InternalException::InternalException(this_02,(string *)local_e0);
        __cxa_throw(this_02,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      ppSVar8 = std::__detail::
                _Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->stmt_scope_mapping_,(key_type *)((long)&filename.field_2 + 8));
      scope = *ppSVar8;
    }
    pmVar4 = &local_38->scope_context_;
    for (p_Var11 = (local_38->scope_context_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      pVVar9 = add_variable<true>(this,(Scope<std::nullptr_t> *)scope,(string *)(p_Var11 + 1),
                                  (string *)&p_Var11[2]._M_parent,SUB41(p_Var11[2]._M_color,0));
      if (pVVar9 != (VarStmt *)0x0) {
        this_01 = (_Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this->enable_conditions_;
        uVar15 = (ulong)local_38 % *(ulong *)(this_01 + 8);
        plVar3 = *(long **)(*(long *)this_01 + uVar15 * 8);
        plVar10 = (long *)0x0;
        if ((plVar3 != (long *)0x0) &&
           (plVar10 = plVar3, plVar18 = (long *)*plVar3, local_38 != (Stmt *)((long *)*plVar3)[1]))
        {
          while (plVar3 = (long *)*plVar18, plVar3 != (long *)0x0) {
            plVar10 = (long *)0x0;
            if (((ulong)plVar3[1] % *(ulong *)(this_01 + 8) != uVar15) ||
               (plVar10 = plVar18, plVar18 = plVar3, local_38 == (Stmt *)plVar3[1]))
            goto LAB_001fc391;
          }
          plVar10 = (long *)0x0;
        }
LAB_001fc391:
        if ((plVar10 != (long *)0x0) && (*plVar10 != 0)) {
          std::__detail::
          _Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at(this_01,&local_38);
          std::__cxx11::string::_M_assign
                    ((string *)&(pVVar9->super_Scope<hgdb::json::VarStmt>).condition);
        }
      }
    }
    local_e0 = (undefined1  [8])
               add_stmt(this,(Scope<std::nullptr_t> *)scope,local_38,(string *)local_68,ln);
    if (local_e0 != (undefined1  [8])0x0) {
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->stmt_scope_mapping_,&local_38,local_e0);
    }
  }
LAB_001fc406:
  if (local_68 != (undefined1  [8])&filename._M_string_length) {
    operator_delete((void *)local_68,
                    CONCAT71(filename._M_string_length._1_7_,(undefined1)filename._M_string_length)
                    + 1);
  }
  return;
}

Assistant:

void handle_stmt(Stmt *stmt) {
        std::string filename;
        uint32_t ln = 0;

        if (stmt->has_attribute("debug-ignore")) return;

        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }

        using namespace hgdb::json;
        auto *parent = stmt->parent();
        hgdb::json::Scope<> *parent_scope;
        if (parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            // this is top level
            auto *scope = module_.create_scope<Scope<>>();
            if (filename.empty()) {
                StmtFileNameVisitor v(stmt_fn_ln_);
                v.visit_root(stmt);
                filename = v.filename;
                ln = v.ln;
            }
            scope->filename = filename;
            parent_scope = scope;
            stmt_scope_mapping_.emplace(stmt, scope);

            if (stmt->type() != StatementType::Assign) {
                // only top level assign, i.e. continuous assignment can
                // have useful scope
                return;
            }

        } else {
            auto *parent_stmt = reinterpret_cast<Stmt *>(parent);
            if (stmt_scope_mapping_.find(parent_stmt) == stmt_scope_mapping_.end()) {
                throw InternalException("Scope not properly created");
            }
            parent_scope = stmt_scope_mapping_.at(parent_stmt);
        }

        // store all the context variables
        // TODO: use stack address as a way to determine the actual scope
        //  for now we flatten everything
        for (auto const &[name, value_pair] : stmt->scope_context()) {
            auto const &[rtl, value] = value_pair;
            // we don't put line number down for static variables
            // since we can't obtain them from Python
            auto *var_stmt = add_variable<true>(parent_scope, name, value, rtl);
            if (var_stmt && enable_conditions_.find(stmt) != enable_conditions_.end()) {
                var_stmt->condition = enable_conditions_.at(stmt);
            }
        }
        // add itself
        auto *stmt_scope = add_stmt(parent_scope, stmt, filename, ln);
        if (stmt_scope) {
            stmt_scope_mapping_.emplace(stmt, stmt_scope);
        }
    }